

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> * __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::getUrlSegment
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *__return_storage_ptr__
          ,HttpRouter<uWS::HttpContextData<false>::RouterData> *this,int urlSegment)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  void *pvVar6;
  ulong uVar7;
  char *pcVar8;
  size_type __n;
  ulong __n_00;
  
  iVar2 = this->urlSegmentTop;
  if (iVar2 < urlSegment) {
    sVar3 = (this->currentUrl)._M_len;
    if (99 < urlSegment || sVar3 == 0) {
      (__return_storage_ptr__->first)._M_len = 0;
      (__return_storage_ptr__->first)._M_str = (char *)0x0;
      bVar5 = true;
      goto LAB_00140164;
    }
    pcVar8 = (this->currentUrl)._M_str + 1;
    (this->currentUrl)._M_str = pcVar8;
    __n_00 = sVar3 - 1;
    (this->currentUrl)._M_len = __n_00;
    if (__n_00 != 0) {
      pvVar6 = memchr(pcVar8,0x2f,__n_00);
      uVar7 = (long)pvVar6 - (long)pcVar8;
      if (uVar7 != 0xffffffffffffffff && pvVar6 != (void *)0x0) {
        if (uVar7 <= __n_00) {
          __n_00 = uVar7;
        }
        this->urlSegmentVector[urlSegment]._M_len = __n_00;
        this->urlSegmentVector[urlSegment]._M_str = pcVar8;
        this->urlSegmentTop = iVar2 + 1;
        uVar4 = (this->currentUrl)._M_len;
        __n_00 = uVar7;
        if (uVar4 < uVar7) goto LAB_0014019d;
        (this->currentUrl)._M_len = uVar4 - uVar7;
        ppcVar1 = &(this->currentUrl)._M_str;
        *ppcVar1 = *ppcVar1 + uVar7;
        goto LAB_00140152;
      }
    }
    this->urlSegmentVector[urlSegment]._M_len = __n_00;
    this->urlSegmentVector[urlSegment]._M_str = pcVar8;
    this->urlSegmentTop = iVar2 + 1;
    uVar7 = (this->currentUrl)._M_len;
    if (uVar7 < __n_00) {
LAB_0014019d:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 __n_00);
    }
    (this->currentUrl)._M_len = uVar7 - __n_00;
    ppcVar1 = &(this->currentUrl)._M_str;
    *ppcVar1 = *ppcVar1 + __n_00;
  }
LAB_00140152:
  pcVar8 = this->urlSegmentVector[urlSegment]._M_str;
  (__return_storage_ptr__->first)._M_len = this->urlSegmentVector[urlSegment]._M_len;
  (__return_storage_ptr__->first)._M_str = pcVar8;
  bVar5 = false;
LAB_00140164:
  __return_storage_ptr__->second = bVar5;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, bool> getUrlSegment(int urlSegment) {
        if (urlSegment > urlSegmentTop) {
            /* Signal as STOP when we have no more URL or stack space */
            if (!currentUrl.length() || urlSegment > 99) {
                return {{}, true};
            }

            /* We always stand on a slash here, so step over it */
            currentUrl.remove_prefix(1);

            auto segmentLength = currentUrl.find('/');
            if (segmentLength == std::string::npos) {
                segmentLength = currentUrl.length();

                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            } else {
                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            }
        }
        /* In any case we return it */
        return {urlSegmentVector[urlSegment], false};
    }